

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

Ptr __thiscall hwnet::TCPSocket::SetErrorCallback(TCPSocket *this,ErrorCallback *callback)

{
  mutex_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard;
  ErrorCallback *callback_local;
  TCPSocket *this_local;
  
  guard._M_device = in_RDX;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)&callback[0x49]._M_invoker);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
             &callback[0x44]._M_invoker,
             (function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)guard._M_device);
  std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this
            ((enable_shared_from_this<hwnet::TCPSocket> *)this);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSocket::Ptr SetErrorCallback(const ErrorCallback &callback){ 
		std::lock_guard<std::mutex> guard(this->mtx);
	    errorCallback_ = callback;
		return shared_from_this();	    
	}